

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_service.hpp
# Opt level: O2

results_type * __thiscall
asio::detail::resolver_service<asio::ip::tcp>::resolve
          (results_type *__return_storage_ptr__,resolver_service<asio::ip::tcp> *this,
          implementation_type *param_1,query_type *qry,error_code *ec)

{
  addrinfo_type *address_info_00;
  auto_addrinfo auto_address_info;
  addrinfo_type *address_info;
  auto_addrinfo local_80;
  addrinfo_type *local_78;
  string local_70;
  string local_50;
  
  local_78 = (addrinfo_type *)0x0;
  std::__cxx11::string::string((string *)&local_50,&qry->host_name_);
  std::__cxx11::string::string((string *)&local_70,&qry->service_name_);
  socket_ops::getaddrinfo
            ((socket_ops *)local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,(char *)qry,
             (addrinfo *)&local_78,(addrinfo **)ec);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  address_info_00 = local_78;
  local_80.ai_ = local_78;
  if (ec->_M_value == 0) {
    std::__cxx11::string::string((string *)&local_50,&qry->host_name_);
    std::__cxx11::string::string((string *)&local_70,&qry->service_name_);
    ip::basic_resolver_results<asio::ip::tcp>::create
              (__return_storage_ptr__,address_info_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).index_ = 0;
  }
  resolver_service_base::auto_addrinfo::~auto_addrinfo(&local_80);
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(implementation_type&, const query_type& qry,
      asio::error_code& ec)
  {
    asio::detail::addrinfo_type* address_info = 0;

    socket_ops::getaddrinfo(qry.host_name().c_str(),
        qry.service_name().c_str(), qry.hints(), &address_info, ec);
    auto_addrinfo auto_address_info(address_info);

    return ec ? results_type() : results_type::create(
        address_info, qry.host_name(), qry.service_name());
  }